

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O3

bool __thiscall LinearSystem::RunDirectGauss(LinearSystem *this,ChoiceType choice_type)

{
  ExtendedMatrix *this_00;
  pointer pOVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  Fraction *pFVar5;
  Fraction FVar6;
  Fraction *b;
  int row;
  Fraction coefficient;
  int local_44;
  vector<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_> *local_40;
  Fraction local_38;
  
  this->rank_ = 0;
  iVar4 = this->n_;
  iVar2 = this->m_;
  if (iVar4 <= this->m_) {
    iVar2 = iVar4;
  }
  if (0 < iVar2) {
    this_00 = &this->system_;
    local_40 = &this->history_;
    iVar4 = 0;
    do {
      bVar3 = Choice(this,iVar4,choice_type);
      if ((bVar3) || (bVar3 = Choice(this,iVar4,Column), bVar3)) {
        this->rank_ = this->rank_ + 1;
        local_44 = 1;
        pFVar5 = ExtendedMatrix::At(this_00,iVar4,iVar4);
        FVar6 = operator/(&local_44,pFVar5);
        PerformOperation(this,MultiplyRow,iVar4,0,FVar6);
        pOVar1 = (this->history_).
                 super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (((this->history_).
             super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>.
             _M_impl.super__Vector_impl_data._M_start != pOVar1) &&
           (pOVar1[-1].operation_type != MainOutput)) {
          std::vector<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>::
          emplace_back<>(local_40);
        }
        row = iVar4 + 1;
        if (row < this->n_) {
          do {
            pFVar5 = ExtendedMatrix::At(this_00,row,iVar4);
            b = ExtendedMatrix::At(this_00,iVar4,iVar4);
            local_38 = operator/(pFVar5,b);
            FVar6 = Fraction::operator-(&local_38);
            PerformOperation(this,AddRow,row,iVar4,FVar6);
            row = row + 1;
          } while (row < this->n_);
        }
        pOVar1 = (this->history_).
                 super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (((this->history_).
             super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>.
             _M_impl.super__Vector_impl_data._M_start != pOVar1) &&
           (pOVar1[-1].operation_type != MainOutput)) {
          std::vector<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>::
          emplace_back<>(local_40);
        }
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != iVar2);
    iVar4 = this->n_;
  }
  this->rank_ = iVar4;
  return iVar4 != 0;
}

Assistant:

bool LinearSystem::RunDirectGauss(Options::ChoiceType choice_type) {
  rank_ = 0;

  int max_pos = std::min(n_, m_);
  for (int pos = 0; pos < max_pos; ++pos) {
    if (!Choice(pos, choice_type) && !Choice(pos)) {
      continue;
    }

    ++rank_;

    PerformOperation(OperationType::MultiplyRow, pos, 0, 1 / system_.At(pos, pos));
    AddMainOutput();

    for (int row = pos + 1; row < n_; ++row) {
      Fraction coefficient = system_.At(row, pos) / system_.At(pos, pos);
      PerformOperation(OperationType::AddRow, row, pos, -coefficient);
    }

    AddMainOutput();
  }

  return rank_ = n_;
}